

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* __thiscall
Graph::color(pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,Graph *this,size_t colors)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  value_type_conflict vVar2;
  bool bVar3;
  reference __x;
  reference pvVar4;
  reference pvVar5;
  size_t sVar6;
  reference pvVar7;
  size_type sVar8;
  iterator __first;
  iterator __last;
  pair<unsigned_long,_unsigned_long> pVar9;
  value_type_conflict local_1b0;
  size_t i_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> info;
  unsigned_long *i_2;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  bitmask_t mask;
  size_t t;
  unsigned_long *i_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<unsigned_long,_unsigned_long> node;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> order;
  DecHeap heap;
  pair<unsigned_long,_unsigned_long> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range1;
  value_type_conflict vStack_88;
  bool failed;
  value_type_conflict local_70;
  undefined1 local_68 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  connections;
  vector<unsigned_long,_std::allocator<unsigned_long>_> result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> data;
  size_t colors_local;
  Graph *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this_00 = &connections.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_68);
  local_70 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,this->N,&local_70);
  vStack_88 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this->N,&stack0xffffffffffffff78);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_68,this->N);
  bVar1 = false;
  __end1 = std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin(&this->graph);
  i = (pair<unsigned_long,_unsigned_long> *)
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::end(&this->graph);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                     *)&i), bVar3) {
    __x = __gnu_cxx::
          __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator*(&__end1);
    this_01 = &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,__x->second
                       );
    *pvVar7 = *pvVar7 + 1;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,__x->first)
    ;
    *pvVar7 = *pvVar7 + 1;
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_68,__x->first);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar5,&__x->second);
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_68,__x->second);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar5,&__x->first);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  DecHeap::DecHeap((DecHeap *)
                   &order.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_node,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
             &node.second);
  do {
    bVar3 = DecHeap::empty((DecHeap *)
                           &order.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      while (bVar3 = std::
                     stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&node.second), ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar4 = std::
                 stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                 top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&node.second);
        mask = *pvVar4;
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&node.second);
        __range2 = (value_type *)0x0;
        pvVar5 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)local_68,mask);
        __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar5);
        i_2 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar5);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                           *)&i_2), bVar3) {
          info.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &connections.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              *info.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          mark((bitmask_t *)&__range2,*pvVar7);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end2);
        }
        sVar6 = ::get((bitmask_t *)&__range2);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &connections.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,mask);
        *pvVar7 = sVar6;
      }
LAB_001981ff:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3);
      if (bVar1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &connections.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (local_1b0 = 0; vVar2 = local_1b0,
            sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &result.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage), vVar2 < sVar8;
            local_1b0 = local_1b0 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3,&local_1b0);
        }
        __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3);
        __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Graph::color(unsigned_long)::__0>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__last._M_current,
                   (anon_class_8_1_898a9ca8)
                   &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
      }
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                (__return_storage_ptr__,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &connections.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_3);
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&node.second);
      DecHeap::~DecHeap((DecHeap *)
                        &order.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &connections.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &result.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    pVar9 = DecHeap::pop((DecHeap *)
                         &order.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node);
    node.first = pVar9.second;
    if (colors <= pVar9.first) {
      bVar1 = true;
      goto LAB_001981ff;
    }
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_68,node.first);
    __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar5);
    i_1 = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar5);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&i_1), bVar3) {
      t = (size_t)__gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&__end3);
      DecHeap::decrease((DecHeap *)
                        &order.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_node,*(size_t *)t,1);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3);
    }
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &node.second,&node.first);
  } while( true );
}

Assistant:

std::pair<std::vector<size_t>, std::vector<size_t>>  Graph::color(size_t colors) {
    std::vector<size_t> data;
    std::vector<size_t> result;
    std::vector<std::vector<size_t>> connections;

    result.resize(N, -1);
    data.resize(N, 0);
    connections.resize(N);

    bool failed = false;
    // degrees
    for (auto& i : graph) {
        data[i.second] += 1;
        data[i.first] += 1;
        connections[i.first].push_back(i.second);
        connections[i.second].push_back(i.first);
    }

    auto heap = DecHeap(data);
    std::stack<size_t> order;
    while (!heap.empty()) {
        auto node = heap.pop();
        if (node.first >= colors) {
            failed = true;
            goto ending;
        } else {
            for (auto & i : connections[node.second]) {
                heap.decrease(i, 1);
            }
            order.push(node.second);
        }
    }
    while (!order.empty()) {
        size_t t = order.top();
        order.pop();
        bitmask_t mask = 0;
        for (auto & i : connections[t]) {
            mark(mask, result[i]);
        }
        result[t] = get(mask);
    }
ending:
    std::vector<size_t> info;
    if (failed) {
        result.clear();
        for(size_t i = 0; i < data.size(); ++i) {
            info.push_back(i);
        }
        std::sort(info.begin(), info.end(), [&](size_t a, size_t b) {return data[a] > data[b]; });
    }
    return {result, info};
}